

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_module(w3Module *this,PCSTR file_name)

{
  uint64_t uVar1;
  size_t in_RCX;
  void *in_RDX;
  uint8_t *local_98;
  uint8_t *cursor;
  string local_70;
  uint local_4c;
  uint local_48;
  uint32_t version;
  uint32_t magic;
  string local_38;
  PCSTR local_18;
  PCSTR file_name_local;
  w3Module *this_local;
  
  local_18 = file_name;
  file_name_local = (PCSTR)this;
  w3MemoryMappedFile::read(&this->mmf,(int)file_name,in_RDX,in_RCX);
  this->base = (uint8_t *)(this->mmf).base;
  uVar1 = w3Fd::get_file_size(&(this->mmf).file,"");
  this->file_size = uVar1;
  this->end = this->base + this->file_size;
  if (this->file_size < 8) {
    StringFormat_abi_cxx11_(&local_38,"too small %s",local_18);
    ThrowString(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  local_48 = GetUint32LE(this->base);
  local_4c = GetUint32LE(this->base + 4);
  printf("magic: %X\n",(ulong)local_48);
  printf("version: %X\n",(ulong)local_4c);
  if (local_48 != 0x6d736100) {
    StringFormat_abi_cxx11_(&local_70,"incorrect magic: %X",(ulong)local_48);
    ThrowString(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (local_4c != 1) {
    StringFormat_abi_cxx11_((string *)&cursor,"incorrect version: %X",(ulong)local_4c);
    ThrowString((string *)&cursor);
    std::__cxx11::string::~string((string *)&cursor);
  }
  if (this->file_size != 8) {
    local_98 = this->base + 8;
    while (local_98 < this->end) {
      read_section(this,&local_98);
    }
    if (local_98 != this->end) {
      AssertFailed("cursor == end");
    }
  }
  return;
}

Assistant:

void w3Module::read_module (PCSTR file_name)
{
    mmf.read (file_name);
    base = (uint8_t*)mmf.base;
    file_size = mmf.file.get_file_size ();
    end = file_size + (uint8_t*)base;

    if (file_size < 8)
        ThrowString (StringFormat ("too small %s", file_name));

    uint32_t magic = GetUint32LE(base);
    uint32_t version = GetUint32LE(base + 4);
    printf ("magic: %X\n", magic);
    printf ("version: %X\n", version);

    if (memcmp (&magic,"\0asm", 4))
        ThrowString (StringFormat ("incorrect magic: %X", magic));

    if (version != 1)
        ThrowString (StringFormat ("incorrect version: %X", (uint32_t)version));

    // Valid module with no sections.
    if (file_size == 8)
        return;

    uint8_t* cursor = base + 8;
    while (cursor < end)
        read_section (&cursor);

    Assert (cursor == end);
}